

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

bool Diligent::VerifyConstantBufferBinding<Diligent::BufferVkImpl>
               (PipelineResourceDesc *ResDesc,BindResourceInfo *BindInfo,BufferVkImpl *pBufferImpl,
               IDeviceObject *pCachedBuffer,Uint64 CachedBaseOffset,Uint64 CachedRangeSize,
               char *SignatureName)

{
  BufferDesc *Args_4;
  Uint64 *Args;
  pointer pcVar1;
  bool bVar2;
  ostream *poVar3;
  RenderDeviceVkImpl *pRVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_02;
  Uint64 UVar5;
  Uint64 UVar6;
  pointer pcVar7;
  char (*in_stack_fffffffffffffdc8) [30];
  string msg;
  Uint32 OffsetAlignment;
  Uint64 local_1f8;
  Uint64 *local_1f0;
  Diligent local_1e8 [32];
  Uint64 local_1c8;
  IDeviceObject *local_1c0;
  stringstream ss;
  ostream local_1a8 [376];
  
  local_1c8 = CachedRangeSize;
  local_1c0 = pCachedBuffer;
  bVar2 = VerifyResourceBinding<Diligent::BufferVkImpl>
                    ("buffer",ResDesc,BindInfo,pBufferImpl,pCachedBuffer,SignatureName);
  if (pBufferImpl == (BufferVkImpl *)0x0) {
    if (BindInfo->BufferRangeSize != 0 || BindInfo->BufferBaseOffset != 0) {
      FormatString<char[55]>
                ((string *)&ss,
                 (char (*) [55])"Non-empty buffer range is specified for a null buffer.");
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x139);
      std::__cxx11::string::~string((string *)&ss);
    }
  }
  else {
    Args_4 = &(pBufferImpl->super_BufferBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
              .m_Desc;
    if (((pBufferImpl->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_Desc.BindFlags & BIND_UNIFORM_BUFFER) == BIND_NONE) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a8,"Error binding buffer \'");
      poVar3 = std::operator<<(poVar3,(Args_4->super_DeviceObjectAttribs).Name);
      poVar3 = std::operator<<(poVar3,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&msg,ResDesc,BindInfo->ArrayIndex);
      poVar3 = std::operator<<(poVar3,(string *)&msg);
      std::operator<<(poVar3,'\'');
      std::__cxx11::string::~string((string *)&msg);
      if (SignatureName != (char *)0x0) {
        poVar3 = std::operator<<(local_1a8," defined by signature \'");
        poVar3 = std::operator<<(poVar3,SignatureName);
        std::operator<<(poVar3,'\'');
      }
      std::operator<<(local_1a8,". The buffer was not created with BIND_UNIFORM_BUFFER flag.");
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&msg,local_1e8,Args_00);
      std::__cxx11::string::~string((string *)local_1e8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0xf8);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      bVar2 = false;
    }
    if (((pBufferImpl->super_BufferBase<Diligent::EngineVkImplTraits>).
         super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
         .m_Desc.Usage == USAGE_DYNAMIC) &&
       ((ResDesc->Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != PIPELINE_RESOURCE_FLAG_NONE)
       ) {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar3 = std::operator<<(local_1a8,"Error binding USAGE_DYNAMIC buffer \'");
      poVar3 = std::operator<<(poVar3,(Args_4->super_DeviceObjectAttribs).Name);
      poVar3 = std::operator<<(poVar3,"\' to variable \'");
      GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&msg,ResDesc,BindInfo->ArrayIndex);
      poVar3 = std::operator<<(poVar3,(string *)&msg);
      std::operator<<(poVar3,'\'');
      std::__cxx11::string::~string((string *)&msg);
      if (SignatureName != (char *)0x0) {
        poVar3 = std::operator<<(local_1a8," defined by signature \'");
        poVar3 = std::operator<<(poVar3,SignatureName);
        std::operator<<(poVar3,'\'');
      }
      std::operator<<(local_1a8,
                      ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag."
                     );
      std::__cxx11::stringbuf::str();
      FormatString<std::__cxx11::string>(&msg,local_1e8,Args_01);
      std::__cxx11::string::~string((string *)local_1e8);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x106);
      std::__cxx11::string::~string((string *)&msg);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      bVar2 = false;
    }
    pcVar7 = (pointer)(BindInfo->BufferRangeSize + BindInfo->BufferBaseOffset);
    Args = &BindInfo->BufferBaseOffset;
    local_1f0 = &(pBufferImpl->super_BufferBase<Diligent::EngineVkImplTraits>).
                 super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                 .m_Desc.Size;
    pcVar1 = (pointer)(pBufferImpl->super_BufferBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                      .m_Desc.Size;
    local_1f8 = CachedBaseOffset;
    if (pcVar1 < pcVar7) {
      msg._M_dataplus._M_p = pcVar7;
      FormatString<char[15],unsigned_long,char[3],unsigned_long,char[25],char_const*,char[11],unsigned_long,char[30]>
                ((string *)&ss,(Diligent *)"Buffer range [",(char (*) [15])Args,
                 (unsigned_long *)0x6bcb09,(char (*) [3])&msg,
                 (unsigned_long *)") specified for buffer \'",(char (*) [25])Args_4,
                 (char **)"\' of size ",(char (*) [11])local_1f0,
                 (unsigned_long *)" is out of the buffer bounds.",in_stack_fffffffffffffdc8);
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x10f);
      std::__cxx11::string::~string((string *)&ss);
      bVar2 = false;
    }
    pRVar4 = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
             ::GetDevice((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                          *)pBufferImpl);
    OffsetAlignment =
         (pRVar4->
         super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
         ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_AdapterInfo.Buffer.
         ConstantBufferOffsetAlignment;
    if (OffsetAlignment == 0) {
      FormatString<char[26],char[21]>
                ((string *)&ss,(Diligent *)"Debug expression failed:\n",(char (*) [26])0x65c7a6,
                 (char (*) [21])(ulong)OffsetAlignment);
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x115);
      std::__cxx11::string::~string((string *)&ss);
    }
    if (*Args % (ulong)OffsetAlignment != 0) {
      FormatString<char[21],unsigned_long,char[67],unsigned_int,char[3]>
                ((string *)&ss,(Diligent *)"Buffer base offset (",(char (*) [21])Args,
                 (unsigned_long *)
                 ") is not a multiple of required constant buffer offset alignment (",
                 (char (*) [67])&OffsetAlignment,(uint *)0x668694,
                 (char (*) [3])in_stack_fffffffffffffdc8);
      DebugAssertionFailed
                (_ss,"VerifyConstantBufferBinding",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                 ,0x119);
      std::__cxx11::string::~string((string *)&ss);
      bVar2 = false;
    }
    if (((pcVar7 <= pcVar1) && (local_1c0 != (IDeviceObject *)0x0)) &&
       (ResDesc->VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC)) {
      UVar5 = *local_1f0 - local_1f8;
      if (local_1c8 != 0) {
        UVar5 = local_1c8;
      }
      UVar6 = *local_1f0 - BindInfo->BufferBaseOffset;
      if (BindInfo->BufferRangeSize != 0) {
        UVar6 = BindInfo->BufferRangeSize;
      }
      if ((BindInfo->BufferBaseOffset != local_1f8) || (UVar5 != UVar6)) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar3 = std::operator<<(local_1a8,"Error binding buffer \'");
        poVar3 = std::operator<<(poVar3,(Args_4->super_DeviceObjectAttribs).Name);
        poVar3 = std::operator<<(poVar3,"\' to variable \'");
        GetShaderResourcePrintName<Diligent::PipelineResourceDesc>
                  (&msg,ResDesc,BindInfo->ArrayIndex);
        poVar3 = std::operator<<(poVar3,(string *)&msg);
        std::operator<<(poVar3,'\'');
        std::__cxx11::string::~string((string *)&msg);
        if (SignatureName != (char *)0x0) {
          poVar3 = std::operator<<(local_1a8," defined by signature \'");
          poVar3 = std::operator<<(poVar3,SignatureName);
          std::operator<<(poVar3,'\'');
        }
        poVar3 = std::operator<<(local_1a8,". The new range [");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,") does not match current range [");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        poVar3 = std::operator<<(poVar3,", ");
        poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
        std::operator<<(poVar3,
                        "). This is treated as binding a new resource even if the buffer itself stays the same. Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset."
                       );
        std::__cxx11::stringbuf::str();
        FormatString<std::__cxx11::string>(&msg,local_1e8,Args_02);
        std::__cxx11::string::~string((string *)local_1e8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyConstantBufferBinding",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
                   ,0x132);
        std::__cxx11::string::~string((string *)&msg);
        std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      }
    }
  }
  return bVar2;
}

Assistant:

bool VerifyConstantBufferBinding(const PipelineResourceDesc& ResDesc,
                                 const BindResourceInfo&     BindInfo,
                                 const BufferImplType*       pBufferImpl,
                                 const IDeviceObject*        pCachedBuffer,
                                 Uint64                      CachedBaseOffset,
                                 Uint64                      CachedRangeSize,
                                 const char*                 SignatureName)
{
    bool BindingOK = VerifyResourceBinding("buffer", ResDesc, BindInfo, pBufferImpl, pCachedBuffer, SignatureName);

    if (pBufferImpl != nullptr)
    {
        const BufferDesc& BuffDesc = pBufferImpl->GetDesc();
        if ((BuffDesc.BindFlags & BIND_UNIFORM_BUFFER) == 0)
        {
            std::stringstream ss;
            ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The buffer was not created with BIND_UNIFORM_BUFFER flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        if (BuffDesc.Usage == USAGE_DYNAMIC && (ResDesc.Flags & PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS) != 0)
        {
            std::stringstream ss;
            ss << "Error binding USAGE_DYNAMIC buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
            if (SignatureName != nullptr)
            {
                ss << " defined by signature '" << SignatureName << '\'';
            }
            ss << ". The variable was initialized with PIPELINE_RESOURCE_FLAG_NO_DYNAMIC_BUFFERS flag.";
            RESOURCE_VALIDATION_FAILURE(ss.str());

            BindingOK = false;
        }

        bool RangeIsOutOfBounds = false;
        if (BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize > BuffDesc.Size)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer range [", BindInfo.BufferBaseOffset, ", ", BindInfo.BufferBaseOffset + BindInfo.BufferRangeSize,
                                        ") specified for buffer '", BuffDesc.Name, "' of size ", BuffDesc.Size, " is out of the buffer bounds.");
            BindingOK          = false;
            RangeIsOutOfBounds = true;
        }

        const Uint32 OffsetAlignment = pBufferImpl->GetDevice()->GetAdapterInfo().Buffer.ConstantBufferOffsetAlignment;
        VERIFY_EXPR(OffsetAlignment != 0);
        if ((BindInfo.BufferBaseOffset % OffsetAlignment) != 0)
        {
            RESOURCE_VALIDATION_FAILURE("Buffer base offset (", BindInfo.BufferBaseOffset, ") is not a multiple of required constant buffer offset alignment (",
                                        OffsetAlignment, ").");
            BindingOK = false;
        }

        if (!RangeIsOutOfBounds && ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC && pCachedBuffer != nullptr)
        {
            if (CachedRangeSize == 0)
                CachedRangeSize = BuffDesc.Size - CachedBaseOffset;
            Uint64 NewBufferRangeSize = BindInfo.BufferRangeSize;
            if (NewBufferRangeSize == 0)
                NewBufferRangeSize = BuffDesc.Size - BindInfo.BufferBaseOffset;

            if (CachedBaseOffset != BindInfo.BufferBaseOffset ||
                CachedRangeSize != NewBufferRangeSize)
            {
                std::stringstream ss;
                ss << "Error binding buffer '" << BuffDesc.Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
                if (SignatureName != nullptr)
                {
                    ss << " defined by signature '" << SignatureName << '\'';
                }
                ss << ". The new range [" << BindInfo.BufferBaseOffset << ", " << BindInfo.BufferBaseOffset + NewBufferRangeSize
                   << ") does not match current range [" << CachedBaseOffset << ", " << CachedBaseOffset + CachedRangeSize
                   << "). This is treated as binding a new resource even if the buffer itself stays the same. "
                      "Use another SRB or label the variable as dynamic, or use SetBufferOffset() method if you only need to change the offset.";
                RESOURCE_VALIDATION_FAILURE(ss.str());
            }
        }
    }
    else
    {
        if (BindInfo.BufferBaseOffset != 0 || BindInfo.BufferRangeSize != 0)
            RESOURCE_VALIDATION_FAILURE("Non-empty buffer range is specified for a null buffer.");
    }

    return BindingOK;
}